

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error pred<44,false>(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  opcode *in_RCX;
  token local_58;
  uint local_30;
  byte local_29;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_29 = 0;
  local_28 = in_RCX;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  confirm_type((token *)ctx,(token_type)op);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_29 = 1;
  }
  local_30 = (uint)bVar1;
  if ((local_29 & 1) == 0) {
    error::~error((error *)ctx);
  }
  if (local_30 == 0) {
    opcode::add_bits(local_28,(long)(int)op_local->reuse << 0x2c);
    if ((op_local->sched).raw == 0) {
      context::tokenize(&local_58,(context *)token_local);
      memcpy(op_local,&local_58,0x24);
      memset(ctx,0,8);
      error::error((error *)ctx);
    }
    else {
      fail((token *)ctx,(char *)op_local,"predicate can\'t be negated");
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(pred)
{
    CHECK(confirm_type(token, token_type::predicate));
    op.add_bits(static_cast<uint64_t>(token.data.predicate.index) << address);
    if constexpr (negable) {
        op.add_bits(static_cast<uint64_t>(token.data.predicate.negated) << (address + 3));
    } else {
        if (token.data.predicate.negated) {
            return fail(token, "predicate can't be negated");
        }
    }
    token = ctx.tokenize();
    return {};
}